

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int on_data_chunk_recv(nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *mem,
                      size_t len,void *userp)

{
  HTTP *pHVar1;
  stream_ctx *stream;
  undefined8 in_RAX;
  Curl_easy *pCVar2;
  ssize_t sVar3;
  CURLcode result;
  CURLcode local_34;
  
  local_34 = (CURLcode)((ulong)in_RAX >> 0x20);
  pCVar2 = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  if (pCVar2 == (Curl_easy *)0x0) {
    if ((((userp != (void *)0x0) &&
         (pCVar2 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10), pCVar2 != (Curl_easy *)0x0
         )) && (((pCVar2->set).field_0x8bd & 0x10) != 0)) && (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(pCVar2,(Curl_cfilter *)userp,"[%d] Data for unknown",(ulong)(uint)stream_id)
      ;
    }
    nghttp2_session_consume(session,stream_id,len);
  }
  else {
    pHVar1 = (pCVar2->req).p.http;
    if (pHVar1 == (HTTP *)0x0) {
      return -0x386;
    }
    stream = (stream_ctx *)pHVar1->h2_ctx;
    if (stream == (stream_ctx *)0x0) {
      return -0x386;
    }
    sVar3 = Curl_bufq_write(&stream->recvbuf,mem,len,&local_34);
    if ((sVar3 < 0) && (local_34 != CURLE_AGAIN)) {
      return -0x386;
    }
    drain_stream((Curl_cfilter *)userp,pCVar2,stream);
  }
  return 0;
}

Assistant:

static int on_data_chunk_recv(nghttp2_session *session, uint8_t flags,
                              int32_t stream_id,
                              const uint8_t *mem, size_t len, void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct stream_ctx *stream;
  struct Curl_easy *data_s;
  ssize_t nwritten;
  CURLcode result;
  (void)flags;

  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */
  DEBUGASSERT(CF_DATA_CURRENT(cf));

  /* get the stream from the hash based on Stream ID */
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    /* Receiving a Stream ID not in the hash should not happen - unless
       we have aborted a transfer artificially and there were more data
       in the pipeline. Silently ignore. */
    CURL_TRC_CF(CF_DATA_CURRENT(cf), cf, "[%d] Data for unknown",
                stream_id);
    /* consumed explicitly as no one will read it */
    nghttp2_session_consume(session, stream_id, len);
    return 0;
  }

  stream = H2_STREAM_CTX(data_s);
  if(!stream)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  nwritten = Curl_bufq_write(&stream->recvbuf, mem, len, &result);
  if(nwritten < 0) {
    if(result != CURLE_AGAIN)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    nwritten = 0;
  }

  /* if we receive data for another handle, wake that up */
  drain_stream(cf, data_s, stream);

  DEBUGASSERT((size_t)nwritten == len);
  return 0;
}